

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

size_t LocalizedText_calcSizeBinary(UA_LocalizedText *src,UA_DataType *_)

{
  size_t sVar1;
  
  if ((src->locale).data == (UA_Byte *)0x0) {
    sVar1 = 1;
  }
  else {
    sVar1 = (src->locale).length + 5;
  }
  if ((src->text).data != (UA_Byte *)0x0) {
    sVar1 = sVar1 + (src->text).length + 4;
  }
  return sVar1;
}

Assistant:

static size_t
LocalizedText_calcSizeBinary(const UA_LocalizedText *src, UA_DataType *_) {
    size_t s = 1; // encoding byte
    if(src->locale.data)
        s += String_calcSizeBinary(&src->locale, NULL);
    if(src->text.data)
        s += String_calcSizeBinary(&src->text, NULL);
    return s;
}